

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

uint count(uint *v,uint len,uint item)

{
  uint uVar1;
  ulong uVar2;
  
  if (len != 0) {
    uVar2 = 0;
    uVar1 = 0;
    do {
      uVar1 = uVar1 + (v[uVar2] == item);
      uVar2 = uVar2 + 1;
    } while (len != uVar2);
    return uVar1;
  }
  return 0;
}

Assistant:

uint32_t count(uint32_t *v, uint32_t len, uint32_t item)
{
    uint32_t c = 0;
    for (uint32_t i = 0; i < len; i++)
        if (v[i] == item)
            c++;
    return c;
}